

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O0

IssuanceParameter * __thiscall
cfd::ConfidentialTransactionContext::SetAssetIssuance
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Amount *issue_amount,
          IssuanceOutputParameter *issue_output,Amount *token_amount,
          IssuanceOutputParameter *token_output,bool is_blind,ByteData256 *contract_hash)

{
  byte bVar1;
  IssuanceParameter *in_RDI;
  Amount *in_R9;
  bool in_stack_00000047;
  Amount *in_stack_00000048;
  vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
  token_output_list;
  vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
  issue_output_list;
  undefined7 in_stack_00000080;
  value_type *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::vector
            ((vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_> *)
             0x40a030);
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::vector
            ((vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_> *)
             0x40a03a);
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::
  push_back((vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_> *)
            CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58)
  ;
  bVar1 = cfd::core::Amount::operator!=(in_R9,0);
  if ((bVar1 & 1) != 0) {
    std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::
    push_back((vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_> *
              )CONCAT17(bVar1,in_stack_ffffffffffffff60),in_stack_ffffffffffffff58);
  }
  SetAssetIssuance((ConfidentialTransactionContext *)
                   issue_output_list.
                   super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (OutPoint *)
                   token_output_list.
                   super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (Amount *)
                   token_output_list.
                   super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
                    *)token_output_list.
                      super__Vector_base<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
                      ._M_impl.super__Vector_impl_data._M_start,in_stack_00000048,
                   (vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>
                    *)CONCAT17(is_blind,in_stack_00000080),in_stack_00000047,
                   (ByteData256 *)issue_output);
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::~vector
            ((vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffff60));
  std::vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_>::~vector
            ((vector<cfd::IssuanceOutputParameter,_std::allocator<cfd::IssuanceOutputParameter>_> *)
             CONCAT17(bVar1,in_stack_ffffffffffffff60));
  return in_RDI;
}

Assistant:

IssuanceParameter ConfidentialTransactionContext::SetAssetIssuance(
    const OutPoint& outpoint, const Amount& issue_amount,
    const IssuanceOutputParameter& issue_output, const Amount& token_amount,
    const IssuanceOutputParameter& token_output, bool is_blind,
    const ByteData256& contract_hash) {
  std::vector<IssuanceOutputParameter> issue_output_list;
  std::vector<IssuanceOutputParameter> token_output_list;
  issue_output_list.push_back(issue_output);
  if (token_amount != 0) token_output_list.push_back(token_output);
  return SetAssetIssuance(
      outpoint, issue_amount, issue_output_list, token_amount,
      token_output_list, is_blind, contract_hash);
}